

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O0

void __thiscall OpenMD::LJ::initialize(LJ *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RDI;
  RealType epsilon;
  RealType sigma;
  LennardJonesInteractionType *ljit;
  AtomType *at2;
  AtomType *at1;
  KeyType keys;
  NonBondedInteractionType *nbt;
  MapTypeIterator j;
  NonBondedInteractionTypeContainer *nbiTypes;
  iterator at;
  AtomType *in_stack_fffffffffffffde8;
  ElemPtr in_stack_fffffffffffffdf0;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffdf8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  errorStruct *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe18;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe20;
  NonBondedInteractionType *in_stack_fffffffffffffe28;
  ForceField *in_stack_fffffffffffffe30;
  RealType in_stack_fffffffffffffe70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe78;
  AtomType *in_stack_fffffffffffffe80;
  AtomType *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  AtomType *in_stack_fffffffffffffeb8;
  LJ *in_stack_fffffffffffffec0;
  string local_100 [32];
  string local_e0 [32];
  LennardJonesInteractionType *local_c0;
  AtomType *local_b8;
  AtomType *local_b0;
  undefined1 local_68 [32];
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  local_48;
  NonBondedInteractionTypeContainer *local_40;
  _Self local_38;
  _Base_ptr local_30;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> local_18;
  undefined4 local_c;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3a0fc8);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x3a0fd9);
  std::
  vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
           *)0x3a0fea);
  *(undefined4 *)(in_RDI + 0x70) = 0;
  ForceField::getNAtomType((ForceField *)0x3a1011);
  local_c = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (value_type_conflict1 *)in_stack_fffffffffffffe10);
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             begin((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                    *)in_stack_fffffffffffffde8);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                *)in_stack_fffffffffffffde8);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffdf0);
    bVar1 = AtomType::isLennardJones((AtomType *)in_stack_fffffffffffffe30);
    if (bVar1) {
      *(int *)(in_RDI + 0x70) = *(int *)(in_RDI + 0x70) + 1;
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffdf0);
  }
  std::
  vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
            *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
  local_30 = (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             begin((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                    *)in_stack_fffffffffffffde8);
  local_18._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                *)in_stack_fffffffffffffde8);
    bVar1 = std::operator!=(&local_18,&local_38);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffdf0);
    bVar1 = AtomType::isLennardJones((AtomType *)in_stack_fffffffffffffe30);
    if (bVar1) {
      std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffdf0);
      addType(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffdf0);
  }
  local_40 = ForceField::getNonBondedInteractionTypes(*(ForceField **)(in_RDI + 0x78));
  std::
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  ::_Rb_tree_iterator(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3a11e0);
  local_68._24_8_ =
       TypeContainer<OpenMD::NonBondedInteractionType,_2>::beginType
                 ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)in_stack_fffffffffffffe10,
                  (MapTypeIterator *)in_stack_fffffffffffffe08);
  while ((NonBondedInteractionType *)local_68._24_8_ != (NonBondedInteractionType *)0x0) {
    bVar1 = NonBondedInteractionType::isLennardJones((NonBondedInteractionType *)local_68._24_8_);
    if (bVar1) {
      TypeContainer<OpenMD::NonBondedInteractionType,_2>::getKeys
                (in_stack_fffffffffffffdf8,(MapTypeIterator *)in_stack_fffffffffffffdf0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffffe00,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffdf8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffe00);
      TypeContainer<OpenMD::NonBondedInteractionType,_2>::getKeys
                (in_stack_fffffffffffffdf8,(MapTypeIterator *)in_stack_fffffffffffffdf0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffffe00,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffdf8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffe00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68,0);
      local_b0 = ForceField::getAtomType
                           (in_stack_fffffffffffffe30,(string *)in_stack_fffffffffffffe28);
      if (local_b0 == (AtomType *)0x0) {
        in_stack_fffffffffffffe94 = 0;
        in_stack_fffffffffffffe70 = 0.0;
        in_stack_fffffffffffffe78 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_stack_fffffffffffffe78,0);
        in_stack_fffffffffffffe80 = (AtomType *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_stack_fffffffffffffe78,(size_type)in_stack_fffffffffffffe70);
        in_stack_fffffffffffffe88 = (AtomType *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_stack_fffffffffffffe78,1);
        uVar2 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "LennardJones::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n"
                 ,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,uVar2);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68,1);
      local_b8 = ForceField::getAtomType
                           (in_stack_fffffffffffffe30,(string *)in_stack_fffffffffffffe28);
      if (local_b8 == (AtomType *)0x0) {
        in_stack_fffffffffffffe30 = (ForceField *)local_68;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe30,1);
        uVar2 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe30,0);
        uVar3 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe30,1);
        uVar4 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "LennardJones::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,uVar2,uVar3,uVar4);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      in_stack_fffffffffffffe28 = (NonBondedInteractionType *)local_68._24_8_;
      if ((NonBondedInteractionType *)local_68._24_8_ == (NonBondedInteractionType *)0x0) {
        local_c0 = (LennardJonesInteractionType *)0x0;
      }
      else {
        local_c0 = (LennardJonesInteractionType *)
                   __dynamic_cast(local_68._24_8_,&NonBondedInteractionType::typeinfo,
                                  &LennardJonesInteractionType::typeinfo,0);
      }
      if (local_c0 == (LennardJonesInteractionType *)0x0) {
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffde8);
        uVar2 = std::__cxx11::string::c_str();
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffde8);
        in_stack_fffffffffffffe08 = local_100;
        uVar3 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffe10 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "LJ::initialize could not convert NonBondedInteractionType\n\tto LennardJonesInteractionType for %s - %s interaction.\n"
                 ,uVar2,uVar3);
        std::__cxx11::string::~string(in_stack_fffffffffffffe08);
        std::__cxx11::string::~string(local_e0);
        *(undefined4 *)((long)in_stack_fffffffffffffe10->errMsg + 0x7d4) = 1;
        *(undefined4 *)((long)in_stack_fffffffffffffe10->errMsg + 2000) = 1;
        simError();
      }
      in_stack_fffffffffffffe00 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)LennardJonesInteractionType::getSigma(local_c0);
      in_stack_fffffffffffffdf8 =
           (TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
           LennardJonesInteractionType::getEpsilon(local_c0);
      addExplicitInteraction
                ((LJ *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 (RealType)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    }
    in_stack_fffffffffffffdf0 =
         TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType
                   ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)in_stack_fffffffffffffe10,
                    (MapTypeIterator *)in_stack_fffffffffffffe08);
    local_68._24_8_ = in_stack_fffffffffffffdf0;
  }
  *(undefined1 *)(in_RDI + 8) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe00);
  return;
}

Assistant:

void LJ::initialize() {
    LJtypes.clear();
    LJtids.clear();
    MixingMap.clear();
    nLJ_ = 0;

    LJtids.resize(forceField_->getNAtomType(), -1);

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isLennardJones()) nLJ_++;
    }

    MixingMap.resize(nLJ_);

    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isLennardJones()) addType(*at);
    }

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    NonBondedInteractionType* nbt;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isLennardJones()) {
        keys          = nbiTypes->getKeys(j);
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "LennardJones::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "LennardJones::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        LennardJonesInteractionType* ljit =
            dynamic_cast<LennardJonesInteractionType*>(nbt);

        if (ljit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "LJ::initialize could not convert NonBondedInteractionType\n"
              "\tto LennardJonesInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType sigma   = ljit->getSigma();
        RealType epsilon = ljit->getEpsilon();
        addExplicitInteraction(at1, at2, sigma, epsilon);
      }
    }
    initialized_ = true;
  }